

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

const_iterator __thiscall Json::Value::end(Value *this)

{
  ValueType VVar1;
  iterator this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Value *in_RDI;
  const_iterator cVar3;
  iterator local_10;
  undefined1 local_8;
  
  VVar1 = type(in_RDI);
  if ((VVar1 == arrayValue || VVar1 == objectValue) && ((in_RDI->value_).int_ != 0)) {
    this_00 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                     *)in_RDI);
    ValueConstIterator::ValueConstIterator((ValueConstIterator *)this_00._M_node,(iterator *)in_RDI)
    ;
    uVar2 = extraout_RDX;
  }
  else {
    ValueConstIterator::ValueConstIterator((ValueConstIterator *)0x20152b);
    uVar2 = extraout_RDX_00;
  }
  cVar3.super_ValueIteratorBase._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  cVar3.super_ValueIteratorBase.isNull_ = (bool)local_8;
  cVar3.super_ValueIteratorBase.current_._M_node = local_10._M_node;
  return (const_iterator)cVar3.super_ValueIteratorBase;
}

Assistant:

Value::const_iterator Value::end() const {
  switch (type()) {
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return const_iterator(value_.map_->end());
    break;
  default:
    break;
  }
  return {};
}